

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfImageLevel.cpp
# Opt level: O2

void __thiscall Imf_3_4::ImageLevel::throwChannelExists(ImageLevel *this,string *name)

{
  ostream *poVar1;
  ArgExc *this_00;
  stringstream _iex_throw_s;
  ostream local_188 [376];
  
  iex_debugTrap();
  std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
  poVar1 = std::operator<<(local_188,"Cannot insert a new image channel with name \"");
  poVar1 = std::operator<<(poVar1,(string *)name);
  std::operator<<(poVar1,"\" into an image level. A channel with the same name exists already.");
  this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_3_4::ArgExc::ArgExc(this_00,(stringstream *)&_iex_throw_s);
  __cxa_throw(this_00,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
}

Assistant:

void
ImageLevel::throwChannelExists (const string& name) const
{
    THROW (
        ArgExc,
        "Cannot insert a new image channel with "
        "name \""
            << name
            << "\" into an image level. "
               "A channel with the same name exists already.");
}